

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

pqpair tnonc_s2pq(double t,double df,double delta)

{
  bool bVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  double dVar9;
  ulong in_XMM2_Qb;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  pqpair pVar15;
  double xx;
  double q;
  double p;
  double local_158;
  double local_150;
  undefined1 local_148 [16];
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  ulong uStack_30;
  double local_20;
  double local_18;
  
  local_148._8_8_ = local_148._0_8_;
  dVar10 = 0.0;
  if (df <= 0.0) {
    dVar2 = 1.0;
  }
  else {
    local_38 = ABS(delta);
    uStack_30 = in_XMM2_Qb & 0x7fffffffffffffff;
    if (1e-08 <= local_38) {
      local_118._8_4_ = in_XMM1_Dc;
      local_118._0_8_ = df;
      local_118._12_4_ = in_XMM1_Dd;
      local_68._8_4_ = in_XMM0_Dc;
      local_68._0_8_ = t;
      local_68._12_4_ = in_XMM0_Dd;
      local_b8 = (double)(-(ulong)(0.0 <= t) & (ulong)delta | ~-(ulong)(0.0 <= t) & (ulong)-delta);
      dStack_b0 = (double)(CONCAT44(in_XMM0_Dd,in_XMM0_Dc) & in_XMM2_Qb |
                          ~CONCAT44(in_XMM0_Dd,in_XMM0_Dc) & (in_XMM2_Qb ^ 0x8000000000000000));
      local_158 = -local_b8;
      cumnor(&local_158,&local_18,&local_20);
      dVar10 = local_68._0_8_;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        local_70 = local_18;
        uVar8 = (undefined4)((ulong)-dVar10 >> 0x20);
        if (-dVar10 <= dVar10) {
          uVar8 = local_68._4_4_;
        }
        local_138 = (double)(~-(ulong)((double)local_118._0_8_ == 1.0) & local_118._0_8_ |
                            -(ulong)((double)local_118._0_8_ == 1.0) & 0x3ff000001ad7f29b);
        dVar10 = (double)CONCAT44(uVar8,local_68._0_4_) * (double)CONCAT44(uVar8,local_68._0_4_);
        local_c8 = local_b8 * 0.5 * local_b8;
        dStack_c0 = dStack_b0;
        local_f8._8_4_ = local_68._8_4_;
        local_f8._0_8_ = dVar10 / (dVar10 + local_138);
        local_f8._12_4_ = local_68._12_4_ ^ 0x80000000;
        dVar10 = (double)(int)local_c8;
        uVar8 = SUB84((double)(int)dStack_b0,0);
        uVar7 = (undefined4)((ulong)(double)(int)dStack_b0 >> 0x20);
        local_118._8_4_ = uVar8;
        local_118._0_8_ = dVar10;
        local_118._12_4_ = uVar7;
        local_e8._8_4_ = uVar8;
        local_e8._0_8_ = dVar10 + 0.5;
        local_e8._12_4_ = uVar7;
        local_108._8_4_ = uVar8;
        local_108._0_8_ = dVar10 + 1.0;
        local_108._12_4_ = uVar7;
        local_138 = local_138 * 0.5;
        uStack_130 = 0;
        dVar10 = log(local_c8);
        local_120 = dVar10 * (double)local_118._0_8_ - local_c8;
        local_158 = (double)local_108._0_8_;
        dVar10 = alngam(&local_158);
        local_d0 = exp(local_120 - dVar10);
        dVar10 = log(local_c8);
        local_158 = (double)local_108._0_8_ + 0.5;
        local_118._0_8_ = dVar10 * (double)local_118._0_8_ - local_c8;
        dVar10 = alngam(&local_158);
        local_118._0_8_ = exp((double)local_118._0_8_ - dVar10);
        local_d8 = betadf((double)local_f8._0_8_,(double)local_e8._0_8_,local_138);
        local_120 = betadf((double)local_f8._0_8_,(double)local_108._0_8_,local_138);
        local_158 = local_138 + (double)local_e8._0_8_;
        local_a8._0_8_ = local_158 + -1.0;
        local_98._8_8_ = local_e8._8_8_;
        local_98._0_8_ = (double)local_e8._0_8_ + -1.0;
        local_128 = 1.0 - (double)local_f8._0_8_;
        local_88._8_4_ = (int)uStack_130;
        local_88._0_8_ = local_158;
        local_88._12_4_ = (int)((ulong)uStack_130 >> 0x20);
        local_a8._8_8_ = uStack_130;
        if ((double)local_a8._0_8_ <= 0.0) {
          local_148._0_8_ = alngam(&local_158);
          local_158 = (double)local_e8._0_8_;
          dVar10 = alngam(&local_158);
          local_148._0_8_ = (double)local_148._0_8_ - dVar10;
          local_158 = local_138;
          dVar10 = alngam(&local_158);
          local_148._0_8_ = (double)local_148._0_8_ - dVar10;
          dVar10 = log((double)local_f8._0_8_);
          local_148._0_8_ = dVar10 * (double)local_98._0_8_ + (double)local_148._0_8_;
          dVar10 = log(local_128);
          dVar10 = exp(dVar10 * local_138 + (double)local_148._0_8_);
          dVar10 = dVar10 / local_a8._0_8_;
          uVar8 = extraout_XMM0_Dc_00;
          uVar7 = extraout_XMM0_Dd_00;
        }
        else {
          local_158 = (double)local_a8._0_8_;
          local_148._0_8_ = alngam(&local_158);
          local_158 = (double)local_e8._0_8_;
          dVar10 = alngam(&local_158);
          local_148._0_8_ = (double)local_148._0_8_ - dVar10;
          local_158 = local_138;
          dVar10 = alngam(&local_158);
          local_148._0_8_ = (double)local_148._0_8_ - dVar10;
          dVar10 = log((double)local_f8._0_8_);
          local_148._0_8_ = dVar10 * (double)local_98._0_8_ + (double)local_148._0_8_;
          dVar10 = log(local_128);
          dVar10 = exp(dVar10 * local_138 + (double)local_148._0_8_);
          uVar8 = extraout_XMM0_Dc;
          uVar7 = extraout_XMM0_Dd;
        }
        iVar6 = (int)local_c8;
        local_148._8_4_ = uVar8;
        local_148._0_8_ = dVar10;
        local_148._12_4_ = uVar7;
        local_a8._0_8_ =
             ((double)CONCAT44(local_a8._4_4_,local_a8._0_4_) * (double)local_f8._0_8_ * dVar10) /
             (double)local_e8._0_8_;
        uVar8 = (undefined4)((ulong)uStack_130 >> 0x20);
        local_98._8_4_ = (int)uStack_130;
        local_98._0_8_ = local_138 + (double)local_108._0_8_;
        local_98._12_4_ = uVar8;
        local_158 = local_138 + (double)local_108._0_8_ + -1.0;
        local_48._8_4_ = (int)uStack_130;
        local_48._0_8_ = local_158;
        local_48._12_4_ = uVar8;
        local_150 = alngam(&local_158);
        local_158 = (double)local_108._0_8_;
        dVar10 = alngam(&local_158);
        local_150 = local_150 - dVar10;
        local_158 = local_138;
        dVar10 = alngam(&local_158);
        local_150 = local_150 - dVar10;
        local_58._8_4_ = local_108._8_4_;
        local_58._0_8_ = local_108._0_8_ + -1.0;
        local_58._12_4_ = local_108._12_4_;
        dVar10 = log((double)local_f8._0_8_);
        local_150 = dVar10 * (double)local_58._0_8_ + local_150;
        dVar10 = log(local_128);
        dVar10 = exp(dVar10 * local_138 + local_150);
        local_128 = (dVar10 * (double)local_f8._0_8_ * (double)local_48._0_8_) /
                    (double)local_108._0_8_;
        dVar9 = 1.0 - local_d0;
        dVar2 = local_b8 / 1.4142135623731;
        dVar12 = local_d0 * local_d8 + (double)local_118._0_8_ * dVar2 * local_120;
        local_138 = (double)local_118._0_8_;
        local_150 = local_d8;
        local_b8 = local_120;
        dVar11 = local_d0;
        iVar3 = 0;
        iVar5 = 0;
        do {
          while( true ) {
            iVar4 = iVar3 + 1;
            dVar13 = (double)iVar4;
            local_148._0_8_ =
                 ((double)local_148._0_8_ * (double)local_f8._0_8_ *
                 (local_88._0_8_ + dVar13 + -2.0)) / ((double)local_e8._0_8_ + dVar13 + -1.0);
            local_d8 = local_d8 - (double)local_148._0_8_;
            dVar11 = (dVar11 * local_c8) / (double)(iVar6 + iVar4);
            dVar10 = (dVar10 * (double)local_f8._0_8_ * ((double)local_98._0_8_ + dVar13 + -2.0)) /
                     ((double)local_108._0_8_ + dVar13 + -1.0);
            local_120 = local_120 - dVar10;
            local_118._0_8_ =
                 ((double)local_118._0_8_ * local_c8) / ((double)(iVar6 + iVar4) + -1.0 + 1.5);
            dVar12 = (double)local_118._0_8_ * local_120 * dVar2 + dVar11 * local_d8 + dVar12;
            if (iVar6 <= iVar5) break;
            local_a8._0_8_ =
                 ((double)local_a8._0_8_ * (((double)local_e8._0_8_ - dVar13) + 1.0)) /
                 ((local_88._0_8_ - dVar13) * (double)local_f8._0_8_);
            local_150 = local_150 + (double)local_a8._0_8_;
            dVar14 = (double)(iVar6 - iVar4) + 1.0;
            local_d0 = (local_d0 * dVar14) / local_c8;
            local_128 = (local_128 * (((double)local_108._0_8_ - dVar13) + 1.0)) /
                        (((double)local_98._0_8_ - dVar13) * (double)local_f8._0_8_);
            local_b8 = local_b8 + local_128;
            local_138 = (local_138 * (dVar14 + 0.5)) / local_c8;
            dVar12 = local_138 * local_b8 * dVar2 + local_d0 * local_150 + dVar12;
            dVar9 = (dVar9 - dVar11) - local_d0;
            if ((dVar9 <= 1e-12) || (bVar1 = 0x270d < iVar3, iVar3 = iVar4, iVar5 = iVar4, bVar1))
            goto LAB_00111bf2;
          }
        } while ((1e-12 < dVar9 * (local_38 * 0.5 + 1.0) * 0.5 * local_d8) &&
                (bVar1 = iVar3 < 0x270e, dVar9 = dVar9 - dVar11, iVar3 = iVar4, bVar1));
LAB_00111bf2:
        local_70 = dVar12 * 0.5 + local_70;
        dVar2 = 1.0 - local_70;
        if ((double)local_68._0_8_ < 0.0) {
          dVar2 = local_70;
        }
        dVar10 = (double)(~-(ulong)(0.0 <= (double)local_68._0_8_) & (ulong)(1.0 - local_70) |
                         (ulong)local_70 & -(ulong)(0.0 <= (double)local_68._0_8_));
      }
      else {
        dVar2 = 1.0 - local_18;
        dVar10 = local_18;
      }
    }
    else {
      pVar15 = student_s2pq(t,df);
      dVar2 = pVar15.q;
      dVar10 = pVar15.p;
    }
  }
  pVar15.q = dVar2;
  pVar15.p = dVar10;
  return pVar15;
}

Assistant:

static pqpair tnonc_s2pq( double t , double df , double delta )
{
   int indx , k , i ;
   double x,del,tnd,ans,y,dels,a,b,c ;
   double pkf,pkb,qkf,qkb , pgamf,pgamb,qgamf,qgamb ;
   double pbetaf,pbetab,qbetaf,qbetab ;
   double ptermf,qtermf,ptermb,qtermb,term ;
   double rempois,delosq2,sum,cons,error ;

   pqpair pq={0.0,1.0} ;  /* will be return value */
   double ab1 ;

   /*-- stupid user? --*/

   if( df <= 0.0 ) return pq ;

   /*-- non-centrality = 0? --*/

   if( fabs(delta) < 1.e-8 ) return student_s2pq(t,df) ;

   /*-- start K's code here --*/

   if( t < 0.0 ){ x = -t ; del = -delta ; indx = 1 ; }  /* x will be */
   else         { x =  t ; del =  delta ; indx = 0 ; }  /* positive */

   ans = gaudf(-del) ;  /* prob that x <= 0 = Normal cdf */

   /*-- the nearly trivial case of x=0 --*/

   if( x == 0.0 ){ pq.p = ans; pq.q = 1.0-ans; return pq; }

   if( df == 1.0 ) df = 1.0000001 ;  /** df=1 is BAD **/

   y = x*x/(df+x*x) ;    /* between 0 and 1 */
   dels = 0.5*del*del ;  /* will be positive */
   k = (int)dels ;       /* 0, 1, 2, ... */
   a = k+0.5 ;           /* might be as small as 0.5 */
   c = k+1.0 ;
   b = 0.5*df ;          /* might be as small as 0.0 */

   pkf = exp(-dels+k*log(dels)-alng(k+1.0)) ;
   pkb = pkf ;
   qkf = exp(-dels+k*log(dels)-alng(k+1.0+0.5)) ;
   qkb = qkf ;

   pbetaf = betadf(y, a, b) ;
   pbetab = pbetaf ;
   qbetaf = betadf(y, c, b) ;
   qbetab = qbetaf ;

   ab1 = a+b-1.0 ;  /* might be as small as -0.5 */

   /*-- RWCox: if a+b-1 < 0, log(Gamma(a+b-1)) won't work;
               instead, use Gamma(a+b-1)=Gamma(a+b)/(a+b-1) --*/

   if( ab1 > 0.0 )
     pgamf = exp(alng(ab1)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y)) ;
   else
     pgamf = exp(alng(a+b)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y))/ab1 ;

   pgamb = pgamf*y*(ab1)/a ;

   /*-- we can't have c+b-1 < 0, so the above patchup isn't needed --*/

   qgamf = exp(alng(c+b-1.0)-alng(c)-alng(b)+(c-1.0)*log(y) + b*log(1.0-y)) ;
   qgamb = qgamf*y*(c+b-1.0)/c ;

   rempois = 1.0 - pkf ;
   delosq2 = del/1.4142135623731 ;
   sum = pkf*pbetaf+delosq2*qkf*qbetaf ;
   cons = 0.5*(1.0 + 0.5*fabs(delta)) ;
   i = 0 ;
L1:
   i = i + 1 ;
   pgamf = pgamf*y*(a+b+i-2.0)/(a+i-1.0) ;
   pbetaf = pbetaf - pgamf ;
   pkf = pkf*dels/(k+i) ;
   ptermf = pkf*pbetaf ;
   qgamf = qgamf*y*(c+b+i-2.0)/(c+i-1.0) ;
   qbetaf = qbetaf - qgamf ;
   qkf = qkf*dels/(k+i-1.0+1.5) ;
   qtermf = qkf*qbetaf ;
   term = ptermf + delosq2*qtermf  ;
   sum = sum + term ;
   error = rempois*cons*pbetaf ;
   rempois = rempois - pkf ;

   if( i > k ){
     if( error <= 1.e-12 || i >= 9999 ) goto L2 ;
     goto L1 ;
   } else {
     pgamb = pgamb*(a-i+1.0)/(y*(a+b-i)) ;
     pbetab = pbetab + pgamb ;
     pkb = (k-i+1.0)*pkb/dels ;
     ptermb = pkb*pbetab  ;
     qgamb = qgamb*(c-i+1.0)/(y*(c+b-i)) ;
     qbetab = qbetab + qgamb ;
     qkb = (k-i+1.0+0.5)*qkb/dels ;
     qtermb = qkb*qbetab  ;
     term =  ptermb + delosq2*qtermb ;
     sum = sum + term  ;
     rempois = rempois - pkb ;
     if (rempois <= 1.e-12 || i >= 9999) goto L2 ;
     goto L1 ;
   }
L2:
   tnd = 0.5*sum + ans ;

   /*-- return a pqpair, not just the cdf --*/

   if( indx ){ pq.p = 1.0-tnd; pq.q = tnd    ; }
   else      { pq.p = tnd    ; pq.q = 1.0-tnd; }
   return pq ;
}